

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

bool R_PlaneInitData(void)

{
  visplane_s *pvVar1;
  long lVar2;
  visplane_t *pvVar3;
  
  pvVar3 = freetail;
  if (freetail != (visplane_t *)0x0) {
    do {
      pvVar1 = pvVar3->next;
      M_Free(pvVar3);
      pvVar3 = pvVar1;
    } while (pvVar1 != (visplane_s *)0x0);
  }
  freetail = (visplane_t *)0x0;
  freehead = &freetail;
  lVar2 = 0;
  do {
    pvVar3 = visplanes[lVar2];
    visplanes[lVar2] = (visplane_t *)0x0;
    while (pvVar3 != (visplane_t *)0x0) {
      pvVar1 = pvVar3->next;
      M_Free(pvVar3);
      pvVar3 = pvVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  return true;
}

Assistant:

bool R_PlaneInitData ()
{
	int i;
	visplane_t *pl;

	// Free all visplanes and let them be re-allocated as needed.
	pl = freetail;

	while (pl)
	{
		visplane_t *next = pl->next;
		M_Free (pl);
		pl = next;
	}
	freetail = NULL;
	freehead = &freetail;

	for (i = 0; i < MAXVISPLANES; i++)
	{
		pl = visplanes[i];
		visplanes[i] = NULL;
		while (pl)
		{
			visplane_t *next = pl->next;
			M_Free (pl);
			pl = next;
		}
	}

	return true;
}